

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O1

CopyPtr<slang::SVQueue> * __thiscall
slang::CopyPtr<slang::SVQueue>::operator=
          (CopyPtr<slang::SVQueue> *this,CopyPtr<slang::SVQueue> *other)

{
  SVQueue *pSVar1;
  
  if (this != other) {
    pSVar1 = this->ptr;
    if (pSVar1 != (SVQueue *)0x0) {
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
                (&pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
      operator_delete(pSVar1,0x58);
    }
    pSVar1 = other->ptr;
    other->ptr = (SVQueue *)0x0;
    this->ptr = pSVar1;
  }
  return this;
}

Assistant:

CopyPtr& operator=(CopyPtr&& other) noexcept {
        if (this != &other) {
            delete ptr;
            ptr = std::exchange(other.ptr, nullptr);
        }
        return *this;
    }